

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSSpStructMatrix.cpp
# Opt level: O2

TPZMatrix<std::complex<double>_> * __thiscall
TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>::
SetupMatrixData(TPZSSpStructMatrix<std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
                *this,TPZStack<long,_10> *elgraph,TPZVec<long> *elgraphindex)

{
  TPZEquationFilter *this_00;
  int colpos;
  int colsize;
  TNode *pTVar1;
  long lVar2;
  bool bVar3;
  TPZSYsmpMatrix<std::complex<double>_> *pTVar4;
  int64_t iVar5;
  int ieq;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int64_t j;
  long lVar11;
  long lVar12;
  long local_2c8;
  int64_t pos;
  TPZSYsmpMatrix<std::complex<double>_> *local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  TPZVec<long> Eq;
  anon_class_32_4_8a2224b8 AddColEqs;
  TPZVec<std::complex<double>_> EqValue;
  TPZVec<long> EqCol;
  TPZRenumbering graph;
  TPZManVector<long,_10> rowdestindices;
  TPZManVector<long,_10> nodegraphindex;
  TPZManVector<long,_10> nodegraph;
  
  iVar5 = (&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
            fEquationFilter.fNumEq)
          [(ulong)(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                  fEquationFilter.fIsActive * 4];
  local_2a8 = (TPZSYsmpMatrix<std::complex<double>_> *)operator_new(0x3d8);
  TPZSYsmpMatrix<std::complex<double>_>::TPZSYsmpMatrix(local_2a8,iVar5,iVar5);
  graph.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZRenumbering_016f4b20;
  graph.fNElements = 0;
  graph.fNNodes = 0;
  graph.fNodeWeights._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  graph.fNodeWeights.fNAlloc = 0;
  graph.fNodeWeights.fStore = (int *)0x0;
  graph.fNodeWeights.fNElements = 0;
  graph.fElementGraph._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  graph.fElementGraph.fStore = (long *)0x0;
  graph.fElementGraph.fNElements = 0;
  graph.fElementGraph.fNAlloc = 0;
  graph.fElementGraphIndex._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  graph.fElementGraphIndex.fNAlloc = 0;
  graph.fElementGraphIndex.fStore = (long *)0x0;
  graph.fElementGraphIndex.fNElements = 0;
  lVar6 = elgraphindex->fNElements;
  graph.fNNodes =
       TPZCompMesh::NIndependentConnects
                 ((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh)
  ;
  graph.fNElements = lVar6 + -1;
  TPZRenumbering::SetElementGraph(&graph,(TPZVec<long> *)elgraph,elgraphindex);
  TPZManVector<long,_10>::TPZManVector(&nodegraph,0);
  TPZManVector<long,_10>::TPZManVector(&nodegraphindex,0);
  TPZRenumbering::ConvertGraph
            (&graph,(TPZVec<long> *)elgraph,elgraphindex,&nodegraph,&nodegraphindex);
  local_2a0 = 1;
  if (1 < nodegraphindex.super_TPZVec<long>.fNElements) {
    local_2a0 = nodegraphindex.super_TPZVec<long>.fNElements;
  }
  this_00 = &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
             fEquationFilter;
  local_2a0 = local_2a0 + -1;
  lVar12 = 0;
  lVar11 = 0;
  lVar6 = 0;
  do {
    if (lVar12 == local_2a0) {
      pos = 0;
      TPZVec<long>::TPZVec(&Eq,lVar11 + 1);
      TPZVec<long>::TPZVec(&EqCol,lVar6);
      rowdestindices.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0x0;
      rowdestindices.super_TPZVec<long>.fStore = (long *)0x0;
      TPZVec<std::complex<double>_>::TPZVec(&EqValue,lVar6,(complex<double> *)&rowdestindices);
      AddColEqs.pos = &pos;
      lVar6 = 0;
      local_2c8 = 0;
      AddColEqs.this = this;
      AddColEqs.EqCol = &EqCol;
      AddColEqs.EqValue = &EqValue;
      do {
        pTVar4 = local_2a8;
        if (lVar6 == local_2a0) {
          Eq.fStore[local_2c8] = pos;
          (*(local_2a8->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable
            ._vptr_TPZSavable[0x4f])(local_2a8,&Eq,&EqCol,&EqValue);
          TPZVec<std::complex<double>_>::~TPZVec(&EqValue);
          TPZVec<long>::~TPZVec(&EqCol);
          TPZVec<long>::~TPZVec(&Eq);
          TPZManVector<long,_10>::~TPZManVector(&nodegraphindex);
          TPZManVector<long,_10>::~TPZManVector(&nodegraph);
          TPZRenumbering::~TPZRenumbering(&graph);
          return &pTVar4->super_TPZMatrix<std::complex<double>_>;
        }
        pTVar1 = (((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh
                  )->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        local_298 = lVar6 * 0x10;
        lVar12 = (long)pTVar1[lVar6].dim;
        lVar11 = (long)pTVar1[lVar6].pos;
        iVar5 = TPZEquationFilter::NumActive(this_00,lVar11,lVar11 + lVar12);
        if (iVar5 != 0) {
          TPZManVector<long,_10>::TPZManVector(&rowdestindices,lVar12);
          if (lVar12 < 1) {
            lVar12 = 0;
          }
          for (lVar8 = 0; lVar12 != lVar8; lVar8 = lVar8 + 1) {
            rowdestindices.super_TPZVec<long>.fStore[lVar8] = lVar11 + lVar8;
          }
          TPZEquationFilter::Filter(this_00,&rowdestindices.super_TPZVec<long>);
          lVar11 = 0;
          while (lVar11 < rowdestindices.super_TPZVec<long>.fNElements) {
            if (rowdestindices.super_TPZVec<long>.fStore[lVar11] != local_2c8) {
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZSSpStructMatrix.cpp"
                         ,0x96);
            }
            Eq.fStore[local_2c8] = pos;
            lVar8 = nodegraphindex.super_TPZVec<long>.fStore[lVar6 + 1];
            bVar3 = false;
            local_290 = lVar11;
            for (lVar12 = nodegraphindex.super_TPZVec<long>.fStore[lVar6]; ieq = (int)local_2c8,
                lVar12 < lVar8; lVar12 = lVar12 + 1) {
              lVar11 = nodegraph.super_TPZVec<long>.fStore[lVar12];
              if (lVar6 <= lVar11) {
                if (lVar6 < lVar11 && !bVar3) {
                  pTVar1 = (((this->super_TPZStructMatrixT<std::complex<double>_>).
                             super_TPZStructMatrix.fMesh)->fBlock).fBlock.
                           super_TPZVec<TPZBlock::TNode>.fStore;
                  bVar3 = true;
                  SetupMatrixData::anon_class_32_4_8a2224b8::operator()
                            (&AddColEqs,*(int *)((long)&pTVar1->dim + local_298),
                             *(int *)((long)&pTVar1->pos + local_298),ieq);
                }
                pTVar1 = (((this->super_TPZStructMatrixT<std::complex<double>_>).
                           super_TPZStructMatrix.fMesh)->fBlock).fBlock.
                         super_TPZVec<TPZBlock::TNode>.fStore;
                colpos = pTVar1[(int)lVar11].pos;
                colsize = pTVar1[(int)lVar11].dim;
                iVar5 = TPZEquationFilter::NumActive(this_00,(long)colpos,(long)(colpos + colsize));
                if (iVar5 != 0) {
                  SetupMatrixData::anon_class_32_4_8a2224b8::operator()
                            (&AddColEqs,colsize,colpos,ieq);
                }
              }
            }
            if (!bVar3) {
              pTVar1 = (((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix
                        .fMesh)->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
              SetupMatrixData::anon_class_32_4_8a2224b8::operator()
                        (&AddColEqs,*(int *)((long)&pTVar1->dim + local_298),
                         *(int *)((long)&pTVar1->pos + local_298),ieq);
            }
            local_2c8 = local_2c8 + 1;
            lVar11 = local_290 + 1;
          }
          TPZManVector<long,_10>::~TPZManVector(&rowdestindices);
        }
        lVar6 = lVar6 + 1;
      } while( true );
    }
    pTVar1 = (((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh)->
             fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
    lVar10 = (long)pTVar1[lVar12].dim;
    lVar8 = (long)pTVar1[lVar12].pos;
    iVar5 = TPZEquationFilter::NumActive(this_00,lVar8,lVar8 + lVar10);
    if (iVar5 != 0) {
      lVar11 = lVar11 + lVar10;
      lVar2 = nodegraphindex.super_TPZVec<long>.fStore[lVar12 + 1];
      lVar6 = lVar6 + ((lVar10 + 1) * lVar10) / 2;
      for (lVar8 = nodegraphindex.super_TPZVec<long>.fStore[lVar12]; lVar8 < lVar2;
          lVar8 = lVar8 + 1) {
        lVar9 = nodegraph.super_TPZVec<long>.fStore[lVar8];
        if (lVar12 <= lVar9) {
          if (lVar9 == lVar12) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZSSpStructMatrix.cpp"
                       ,0x5d);
          }
          pTVar1 = (((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                    fMesh)->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
          lVar7 = (long)pTVar1[(int)lVar9].dim;
          lVar9 = (long)pTVar1[(int)lVar9].pos;
          iVar5 = TPZEquationFilter::NumActive(this_00,lVar9,lVar9 + lVar7);
          lVar7 = lVar7 * lVar10;
          if (iVar5 == 0) {
            lVar7 = 0;
          }
          lVar6 = lVar6 + lVar7;
        }
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

TPZMatrix<TVar> * TPZSSpStructMatrix<TVar,TPar>::SetupMatrixData(TPZStack<int64_t> & elgraph, TPZVec<int64_t> &elgraphindex){
    
    const int64_t neq = this->fEquationFilter.NActiveEquations();
    TPZSYsmpMatrix<TVar> * mat = new TPZSYsmpMatrix<TVar>(neq,neq);
    
    /**Creates a element graph*/
    TPZRenumbering graph;
    graph.SetElementsNodes(elgraphindex.NElements() -1
                           ,this->fMesh->NIndependentConnects());
    graph.SetElementGraph(elgraph,elgraphindex);
    
    TPZManVector<int64_t> nodegraph;
    TPZManVector<int64_t> nodegraphindex;
    /**
     *converts an element graph structure into a node graph structure
     *those vectors have size ZERO !!!
     */
    graph.ConvertGraph(elgraph,elgraphindex,nodegraph,nodegraphindex);
    /**vector sizes*/
    const int64_t nblock = nodegraphindex.NElements()-1;
    // number of values in the sparse matrix
    int64_t totalvar = 0;
    // number of equations
    int64_t totaleq = 0;
    for(auto i=0;i<nblock;i++){
        const int64_t iblsize = this->fMesh->Block().Size(i);
        const int64_t iblpos = this->fMesh->Block().Position(i);
        const int64_t numactive = this->fEquationFilter.NumActive(iblpos, iblpos+iblsize);
        if (!numactive) {
            continue;
        }
        totaleq += iblsize;
        const int64_t icfirst = nodegraphindex[i];
        const int64_t iclast = nodegraphindex[i+1];
        //longhin
        totalvar+=(iblsize*(iblsize+1))/2;
        for(auto j=icfirst;j<iclast;j++) {
            const int64_t col = nodegraph[j];
            if (col < i) {
                continue;
            }
            
            if (col == i) {
                DebugStop();
            }
            
            const int64_t colsize = this->fMesh->Block().Size(col);
            const int64_t colpos = this->fMesh->Block().Position(col);
            const int64_t numactive = this->fEquationFilter.NumActive(colpos, colpos+colsize);
            if (!numactive) {
                continue;
            }
            totalvar += iblsize*colsize;
        }
    }
    
    int64_t ieq = 0;
    // pos is the position where we will put the column value
    int64_t pos = 0;
    
    TPZVec<int64_t> Eq(totaleq+1);
    TPZVec<int64_t> EqCol(totalvar);
    TPZVec<TVar> EqValue(totalvar,0.);
    //lambda for avoid repeating code
    //lambda for avoid repeating code
    auto AddColEqs =
        [this,&EqCol,&EqValue,&pos](const int colsize, const int colpos, const int ieq)
        {
            TPZManVector<int64_t> destindices(colsize);
            for (int64_t i=0; i<colsize; i++) {
                destindices[i] = colpos+i;
            }
            this->fEquationFilter.Filter(destindices);
            for(auto jbleq=0; jbleq<destindices.size(); jbleq++) {
                const int64_t jeq = destindices[jbleq];
                if (jeq < ieq) {
                    continue;
                }
                EqCol[pos] = destindices[jbleq];
                EqValue[pos] = 0.;
                pos++;
            }
        };
    
    for(auto i=0;i<nblock;i++){
        const int64_t iblsize = this->fMesh->Block().Size(i);
        const int64_t iblpos = this->fMesh->Block().Position(i);
        const int64_t numactive =
            this->fEquationFilter.NumActive(iblpos, iblpos+iblsize);
        if (!numactive) {
            continue;
        }
        TPZManVector<int64_t> rowdestindices(iblsize);
        for (int64_t i=0; i<iblsize; i++) {
            rowdestindices[i] = iblpos+i;
        }
        this->fEquationFilter.Filter(rowdestindices);
        // working equation by equation
        for(auto ibleq=0; ibleq<rowdestindices.size(); ibleq++) {
            if (rowdestindices[ibleq] != ieq) {
                DebugStop();
            }
            Eq[ieq] = pos;
            bool diagonalinsert = false;
            const int64_t icfirst = nodegraphindex[i];
            const int64_t iclast = nodegraphindex[i+1];
            for(auto j=icfirst;j<iclast;j++)
            {
                const int64_t col = nodegraph[j];
                if (col < i) {
                    continue;
                }
                // force the diagonal block to be inserted
                // the nodegraph does not contain the pointer to itself
                if(!diagonalinsert && col > i)
                {
                    diagonalinsert = true;
                    const auto colsize = this->fMesh->Block().Size(i);
                    const auto colpos = this->fMesh->Block().Position(i);
                    AddColEqs(colsize,colpos,ieq);
                }
                const auto colsize = this->fMesh->Block().Size(col);
                const auto colpos = this->fMesh->Block().Position(col);
                if (this->fEquationFilter.NumActive(colpos, colpos+colsize) == 0) {
                    continue;
                }
                AddColEqs(colsize,colpos,ieq);
            }
            // all elements are below (last block certainly)
            if(!diagonalinsert)
            {
                diagonalinsert = true;
                const auto colsize = this->fMesh->Block().Size(i);
                const auto colpos = this->fMesh->Block().Position(i);
                AddColEqs(colsize,colpos,ieq);
            }
            ieq++;
        }
    }

    Eq[ieq] = pos;
    mat->SetData(Eq,EqCol,EqValue);
    return mat;
}